

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

HighsStatus __thiscall
Highs::passHessian(Highs *this,HighsInt dim,HighsInt num_nz,HighsInt format,HighsInt *start,
                  HighsInt *index,double *value)

{
  bool bVar1;
  HighsStatus HVar2;
  HighsHessian hessian;
  HighsHessian local_80;
  
  logHeader(this);
  HighsHessian::HighsHessian(&hessian);
  bVar1 = qFormatOk(this,num_nz,format);
  if (bVar1) {
    if ((this->model_).lp_.num_col_ == dim) {
      hessian.format_ = kTriangular;
      hessian.dim_ = dim;
      if (0 < dim) {
        std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
                  ((vector<int,std::allocator<int>> *)&hessian.start_,start,start + (uint)dim);
        std::vector<int,_std::allocator<int>_>::resize(&hessian.start_,(ulong)(dim + 1));
        hessian.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_start[(uint)dim] = num_nz;
      }
      if (0 < num_nz) {
        std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
                  ((vector<int,std::allocator<int>> *)&hessian.index_,index,index + (uint)num_nz);
        std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
                  ((vector<double,std::allocator<double>> *)&hessian.value_,value,
                   value + (uint)num_nz);
      }
      HighsHessian::HighsHessian(&local_80,&hessian);
      HVar2 = passHessian(this,&local_80);
      HighsHessian::~HighsHessian(&local_80);
      goto LAB_00231dfe;
    }
  }
  else {
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                 "Model has illegal Hessian matrix format\n");
  }
  HVar2 = kError;
LAB_00231dfe:
  HighsHessian::~HighsHessian(&hessian);
  return HVar2;
}

Assistant:

HighsStatus Highs::passHessian(const HighsInt dim, const HighsInt num_nz,
                               const HighsInt format, const HighsInt* start,
                               const HighsInt* index, const double* value) {
  this->logHeader();
  HighsHessian hessian;
  if (!qFormatOk(num_nz, format)) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Model has illegal Hessian matrix format\n");
    return HighsStatus::kError;
  }
  HighsInt num_col = model_.lp_.num_col_;
  if (dim != num_col) return HighsStatus::kError;
  hessian.dim_ = num_col;
  hessian.format_ = HessianFormat::kTriangular;
  if (dim > 0) {
    assert(start != NULL);
    hessian.start_.assign(start, start + num_col);
    hessian.start_.resize(num_col + 1);
    hessian.start_[num_col] = num_nz;
  }
  if (num_nz > 0) {
    assert(index != NULL);
    assert(value != NULL);
    hessian.index_.assign(index, index + num_nz);
    hessian.value_.assign(value, value + num_nz);
  }
  return passHessian(hessian);
}